

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O0

double __thiscall
ProblemDecTigerWithCreaks::GetObsProb
          (ProblemDecTigerWithCreaks *this,Index ja,Index s,Index agentI,Index oI)

{
  Index IVar1;
  undefined8 uVar2;
  int in_ECX;
  int in_EDX;
  Index in_ESI;
  undefined4 in_R8D;
  Index in_stack_fffffffffffffe28;
  Index in_stack_fffffffffffffe2c;
  Index in_stack_fffffffffffffe30;
  Index in_stack_fffffffffffffe34;
  Index in_stack_fffffffffffffe38;
  Index in_stack_fffffffffffffe3c;
  Index in_stack_fffffffffffffe40;
  Index in_stack_fffffffffffffe44;
  double local_8;
  
  if (in_ECX == 0) {
    switch(in_R8D) {
    case 0:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0425;
        }
        if (in_EDX == 1) {
          return 0.0075;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0425;
          }
          if (in_EDX == 1) {
            return 0.0075;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.765;
            }
            if (in_EDX == 1) {
              return 0.135;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    case 1:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0425;
        }
        if (in_EDX == 1) {
          return 0.0075;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.765;
          }
          if (in_EDX == 1) {
            return 0.135;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.0425;
            }
            if (in_EDX == 1) {
              return 0.0075;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    case 2:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.765;
        }
        if (in_EDX == 1) {
          return 0.135;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0425;
          }
          if (in_EDX == 1) {
            return 0.0075;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.0425;
            }
            if (in_EDX == 1) {
              return 0.0075;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    case 3:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0075;
        }
        if (in_EDX == 1) {
          return 0.0425;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0075;
          }
          if (in_EDX == 1) {
            return 0.0425;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.135;
            }
            if (in_EDX == 1) {
              return 0.765;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    case 4:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0075;
        }
        if (in_EDX == 1) {
          return 0.0425;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.135;
          }
          if (in_EDX == 1) {
            return 0.765;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.0075;
            }
            if (in_EDX == 1) {
              return 0.0425;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    case 5:
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.135;
        }
        if (in_EDX == 1) {
          return 0.765;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0075;
          }
          if (in_EDX == 1) {
            return 0.0425;
          }
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            return 0.16666666666666666;
          }
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            if (in_EDX == 0) {
              return 0.0075;
            }
            if (in_EDX == 1) {
              return 0.0425;
            }
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              return 0.16666666666666666;
            }
          }
        }
      }
    }
  }
  else if (in_ECX != 1) goto switchD_00993663_default;
  switch(in_R8D) {
  case 0:
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      if (in_EDX == 0) {
        return 0.0425;
      }
      if (in_EDX == 1) {
        return 0.0075;
      }
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0425;
        }
        if (in_EDX == 1) {
          return 0.0075;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.765;
          }
          if (in_EDX == 1) {
            return 0.135;
          }
        }
      }
    }
  case 1:
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      if (in_EDX == 0) {
        return 0.0425;
      }
      if (in_EDX == 1) {
        return 0.0075;
      }
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.765;
        }
        if (in_EDX == 1) {
          return 0.135;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0425;
          }
          if (in_EDX == 1) {
            return 0.0075;
          }
        }
      }
    }
  case 2:
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      if (in_EDX == 0) {
        return 0.765;
      }
      if (in_EDX == 1) {
        return 0.135;
      }
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0425;
        }
        if (in_EDX == 1) {
          return 0.0075;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.0425;
          }
          if (in_EDX == 1) {
            return 0.0075;
          }
        }
      }
    }
  case 3:
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      if (in_EDX == 0) {
        return 0.0075;
      }
      if (in_EDX == 1) {
        return 0.0425;
      }
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        return 0.16666666666666666;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        if (in_EDX == 0) {
          return 0.0075;
        }
        if (in_EDX == 1) {
          return 0.0425;
        }
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          return 0.16666666666666666;
        }
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          if (in_EDX == 0) {
            return 0.135;
          }
          if (in_EDX == 1) {
            return 0.765;
          }
        }
      }
    }
  case 4:
    break;
  case 5:
    goto switchD_00993663_caseD_5;
  default:
    goto switchD_00993663_default;
  }
  IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  if (in_ESI == IVar1) {
    if (in_EDX == 0) {
      return 0.0075;
    }
    if (in_EDX == 1) {
      return 0.0425;
    }
  }
  else {
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      return 0.16666666666666666;
    }
    in_stack_fffffffffffffe44 = in_ESI;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_ESI,in_stack_fffffffffffffe40),in_stack_fffffffffffffe3c
                                ,in_stack_fffffffffffffe38);
    if (in_stack_fffffffffffffe44 == IVar1) {
      return 0.16666666666666666;
    }
    in_stack_fffffffffffffe40 = in_ESI;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_ESI),in_stack_fffffffffffffe3c
                                ,in_stack_fffffffffffffe38);
    if (in_stack_fffffffffffffe40 == IVar1) {
      return 0.16666666666666666;
    }
    in_stack_fffffffffffffe3c = in_ESI;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_ESI
                                ,in_stack_fffffffffffffe38);
    if (in_stack_fffffffffffffe3c == IVar1) {
      return 0.16666666666666666;
    }
    in_stack_fffffffffffffe38 = in_ESI;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_ESI);
    if (in_stack_fffffffffffffe38 == IVar1) {
      return 0.16666666666666666;
    }
    in_stack_fffffffffffffe34 = in_ESI;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_stack_fffffffffffffe34 == IVar1) {
      if (in_EDX == 0) {
        return 0.135;
      }
      if (in_EDX == 1) {
        return 0.765;
      }
    }
    else {
      in_stack_fffffffffffffe30 = in_ESI;
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_stack_fffffffffffffe30 == IVar1) {
        return 0.16666666666666666;
      }
      in_stack_fffffffffffffe2c = in_ESI;
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_stack_fffffffffffffe2c == IVar1) {
        if (in_EDX == 0) {
          return 0.0075;
        }
        if (in_EDX == 1) {
          return 0.0425;
        }
      }
    }
  }
switchD_00993663_caseD_5:
  in_stack_fffffffffffffe28 = in_ESI;
  IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  if (in_stack_fffffffffffffe28 == IVar1) {
    if (in_EDX == 0) {
      local_8 = 0.135;
    }
    else {
      if (in_EDX != 1) goto switchD_00993663_default;
      local_8 = 0.765;
    }
  }
  else {
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (in_ESI == IVar1) {
      local_8 = 0.16666666666666666;
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
      if (in_ESI == IVar1) {
        local_8 = 0.16666666666666666;
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                    in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        if (in_ESI == IVar1) {
          local_8 = 0.16666666666666666;
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                      in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
          if (in_ESI == IVar1) {
            local_8 = 0.16666666666666666;
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ),in_stack_fffffffffffffe3c,
                                        in_stack_fffffffffffffe38);
            if (in_ESI == IVar1) {
              local_8 = 0.16666666666666666;
            }
            else {
              IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                          CONCAT44(in_stack_fffffffffffffe44,
                                                   in_stack_fffffffffffffe40),
                                          in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
              if (in_ESI == IVar1) {
                if (in_EDX == 0) {
                  local_8 = 0.0075;
                }
                else {
                  if (in_EDX != 1) goto switchD_00993663_default;
                  local_8 = 0.0425;
                }
              }
              else {
                IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                            CONCAT44(in_stack_fffffffffffffe44,
                                                     in_stack_fffffffffffffe40),
                                            in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
                if (in_ESI == IVar1) {
                  local_8 = 0.16666666666666666;
                }
                else {
                  IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                              CONCAT44(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40),
                                              in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
                  if (in_ESI != IVar1) {
switchD_00993663_default:
                    uVar2 = __cxa_allocate_exception(0x28);
                    E::E((E *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                    __cxa_throw(uVar2,&E::typeinfo,E::~E);
                  }
                  if (in_EDX == 0) {
                    local_8 = 0.0075;
                  }
                  else {
                    if (in_EDX != 1) goto switchD_00993663_default;
                    local_8 = 0.0425;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

double ProblemDecTigerWithCreaks::GetObsProb(Index ja,
                                             Index s,
                                             Index agentI,
                                             Index oI) const
{
    switch(agentI)
    {
    case 0:
        switch(oI)
        {
        case GROWLLEFT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLLEFT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLLEFT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        case GROWLRIGHT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
                return(1.0/6);
        }
    case 1:
        switch(oI)
        {
        case GROWLLEFT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
        case GROWLLEFT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
        case GROWLLEFT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.85*0.9); else if(s==SRIGHT) return(0.15*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.85*0.05); else if(s==SRIGHT) return(0.15*0.05);}
        case GROWLRIGHT_CREAKLEFT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
        case GROWLRIGHT_CREAKRIGHT:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
        case GROWLRIGHT_SILENCE:
            if(ja==GetJointActionIndex(LISTEN,LISTEN))
            { if(s==SLEFT) return(0.15*0.9); else if(s==SRIGHT) return(0.85*0.9);}
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT))
                return(1.0/6);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN))
            { if(s==SLEFT) return(0.15*0.05); else if(s==SRIGHT) return(0.85*0.05);}
        }
    }

    throw(E("ProblemDecTigerWithCreaks::GetObsProb should never get here"));
    return(42);
}